

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctfst.c
# Opt level: O2

void jpeg_idct_ifast(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  JSAMPLE JVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  short sVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  short sVar15;
  long lVar16;
  JSAMPLE *pJVar17;
  short sVar18;
  short sVar19;
  int iVar20;
  uint uVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  int iVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  int iVar29;
  undefined1 auVar30 [16];
  uint auStack_154 [7];
  uint auStack_138 [66];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  for (lVar12 = 0; (int)lVar12 != 8; lVar12 = lVar12 + 1) {
    sVar24 = coef_block[lVar12 + 0x10];
    if (sVar24 == 0 && coef_block[lVar12 + 8] == 0) {
      if (((coef_block[lVar12 + 0x18] != 0) || (coef_block[lVar12 + 0x20] != 0)) ||
         ((coef_block[lVar12 + 0x28] != 0 ||
          ((coef_block[lVar12 + 0x30] != 0 || (coef_block[lVar12 + 0x38] != 0)))))) {
        sVar24 = 0;
        goto LAB_00141b7f;
      }
      uVar21 = (int)*(short *)((long)pvVar3 + lVar12 * 2) * (int)coef_block[lVar12];
      auStack_154[lVar12 + 7] = uVar21;
      auStack_154[lVar12 + 0xf] = uVar21;
      auStack_154[lVar12 + 0x17] = uVar21;
      auStack_154[lVar12 + 0x1f] = uVar21;
      auStack_154[lVar12 + 0x27] = uVar21;
      auStack_154[lVar12 + 0x2f] = uVar21;
      auStack_154[lVar12 + 0x37] = uVar21;
      lVar16 = 0xe0;
    }
    else {
LAB_00141b7f:
      sVar15 = *(short *)((long)pvVar3 + lVar12 * 2) * coef_block[lVar12];
      sVar24 = sVar24 * *(short *)((long)pvVar3 + lVar12 * 2 + 0x20);
      sVar5 = *(short *)((long)pvVar3 + lVar12 * 2 + 0x40) * coef_block[lVar12 + 0x20];
      sVar18 = *(short *)((long)pvVar3 + lVar12 * 2 + 0x60) * coef_block[lVar12 + 0x30];
      sVar22 = sVar18 + sVar24;
      sVar10 = sVar5 + sVar15;
      sVar15 = sVar15 - sVar5;
      sVar24 = (short)((uint)(((int)sVar24 - (int)sVar18) * 0x16a00) >> 0x10) - sVar22;
      sVar18 = coef_block[lVar12 + 8] * *(short *)((long)pvVar3 + lVar12 * 2 + 0x10);
      sVar26 = *(short *)((long)pvVar3 + lVar12 * 2 + 0x30) * coef_block[lVar12 + 0x18];
      sVar19 = *(short *)((long)pvVar3 + lVar12 * 2 + 0x50) * coef_block[lVar12 + 0x28];
      sVar5 = *(short *)((long)pvVar3 + lVar12 * 2 + 0x70) * coef_block[lVar12 + 0x38];
      sVar23 = sVar19 + sVar26;
      sVar27 = sVar5 + sVar18;
      sVar28 = sVar27 + sVar23;
      iVar13 = (int)(short)(sVar19 - sVar26);
      iVar20 = (int)(short)(sVar18 - sVar5);
      uVar21 = (iVar20 + iVar13) * 0x1d900 & 0xffff0000;
      sVar18 = (short)(iVar13 * -0x29d00 + uVar21 >> 0x10) - sVar28;
      sVar5 = (short)((uint)(((int)sVar27 - (int)sVar23) * 0x16a00) >> 0x10) - sVar18;
      iVar13 = (int)(short)(sVar10 + sVar22);
      auStack_154[lVar12 + 7] = iVar13 + sVar28;
      auStack_154[lVar12 + 0x3f] = iVar13 - sVar28;
      iVar13 = (int)(short)(sVar24 + sVar15);
      auStack_154[lVar12 + 0xf] = sVar18 + iVar13;
      auStack_154[lVar12 + 0x37] = iVar13 - sVar18;
      iVar13 = (int)(short)(sVar15 - sVar24);
      auStack_154[lVar12 + 0x17] = sVar5 + iVar13;
      auStack_154[lVar12 + 0x2f] = iVar13 - sVar5;
      iVar13 = (int)(short)(sVar10 - sVar22);
      iVar20 = (int)(short)((short)(iVar20 * 0x11500 - uVar21 >> 0x10) + sVar5);
      auStack_154[lVar12 + 0x27] = iVar20 + iVar13;
      uVar21 = iVar13 - iVar20;
      lVar16 = 0x60;
    }
    *(uint *)((long)auStack_154 + lVar12 * 4 + lVar16 + 0x1c) = uVar21;
  }
  lVar12 = 7;
  do {
    if (lVar12 == 0x47) {
      return;
    }
    pJVar17 = (JSAMPLE *)(*(long *)((long)output_buf + lVar12 + -7) + (ulong)output_col);
    uVar21 = auStack_154[lVar12 + 1];
    uVar9 = auStack_154[lVar12 + 2];
    if (auStack_154[lVar12 + 2] == 0 && uVar21 == 0) {
      uVar11 = 0;
      uVar9 = 0;
      if ((((auStack_154[lVar12 + 3] != 0) || (auStack_154[lVar12 + 4] != 0)) ||
          (uVar9 = uVar11, auStack_154[lVar12 + 5] != 0)) ||
         ((auStack_154[lVar12 + 6] != 0 || (auStack_154[lVar12 + 7] != 0)))) goto LAB_00141d7e;
      JVar4 = pJVar2[(ulong)(auStack_154[lVar12] >> 5 & 0x3ff) + 0x80];
      auVar30 = pshuflw(ZEXT216(CONCAT11(JVar4,JVar4)),ZEXT216(CONCAT11(JVar4,JVar4)),0);
      *(int *)pJVar17 = auVar30._0_4_;
      pJVar17[4] = JVar4;
      pJVar17[5] = JVar4;
      pJVar17[6] = JVar4;
      lVar16 = 7;
    }
    else {
LAB_00141d7e:
      iVar13 = auStack_154[lVar12 + 4] + auStack_154[lVar12];
      iVar25 = auStack_154[lVar12] - auStack_154[lVar12 + 4];
      iVar20 = auStack_154[lVar12 + 6] + uVar9;
      iVar29 = iVar20 + iVar13;
      iVar13 = iVar13 - iVar20;
      iVar7 = ((int)(short)uVar9 - (int)(short)auStack_154[lVar12 + 6]) * 0x16a00 +
              iVar20 * -0x10000 >> 0x10;
      iVar20 = iVar7 + iVar25;
      iVar25 = iVar25 - iVar7;
      iVar7 = auStack_154[lVar12 + 3] + auStack_154[lVar12 + 5];
      iVar1 = auStack_154[lVar12 + 7] + uVar21;
      iVar14 = iVar1 + iVar7;
      iVar6 = (int)(short)((short)auStack_154[lVar12 + 5] - (short)auStack_154[lVar12 + 3]);
      iVar8 = (int)(short)((short)uVar21 - (short)auStack_154[lVar12 + 7]);
      uVar9 = (iVar8 + iVar6) * 0x1d900 & 0xffff0000;
      uVar21 = iVar6 * -0x29d00 + iVar14 * -0x10000 + uVar9;
      iVar6 = (int)uVar21 >> 0x10;
      uVar21 = ((int)(short)iVar1 - (int)(short)iVar7) * 0x16a00 - (uVar21 & 0xffff0000);
      iVar7 = (int)uVar21 >> 0x10;
      *pJVar17 = pJVar2[(ulong)((uint)(iVar14 + iVar29) >> 5 & 0x3ff) + 0x80];
      pJVar17[7] = pJVar2[(ulong)((uint)(iVar29 - iVar14) >> 5 & 0x3ff) + 0x80];
      pJVar17[1] = pJVar2[(ulong)((uint)(iVar6 + iVar20) >> 5 & 0x3ff) + 0x80];
      pJVar17[6] = pJVar2[(ulong)((uint)(iVar20 - iVar6) >> 5 & 0x3ff) + 0x80];
      pJVar17[2] = pJVar2[(ulong)((uint)(iVar7 + iVar25) >> 5 & 0x3ff) + 0x80];
      pJVar17[5] = pJVar2[(ulong)((uint)(iVar25 - iVar7) >> 5 & 0x3ff) + 0x80];
      iVar20 = (int)((uVar21 & 0xffff0000) + (iVar8 * 0x11500 - uVar9)) >> 0x10;
      pJVar17[4] = pJVar2[(ulong)((uint)(iVar13 + iVar20) >> 5 & 0x3ff) + 0x80];
      JVar4 = pJVar2[(ulong)((uint)(iVar13 - iVar20) >> 5 & 0x3ff) + 0x80];
      lVar16 = 3;
    }
    pJVar17[lVar16] = JVar4;
    lVar12 = lVar12 + 8;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_ifast(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  IFAST_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];      /* buffers data between passes */
  SHIFT_TEMPS                   /* for DESCALE */
  ISHIFT_TEMPS                  /* for IDESCALE */

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (IFAST_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      int dcval = (int)DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = tmp0 + tmp2;        /* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;        /* phases 5-3 */
    tmp12 = MULTIPLY(tmp1 - tmp3, FIX_1_414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;       /* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    z13 = tmp6 + tmp5;          /* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, -FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    wsptr[DCTSIZE * 0] = (int)(tmp0 + tmp7);
    wsptr[DCTSIZE * 7] = (int)(tmp0 - tmp7);
    wsptr[DCTSIZE * 1] = (int)(tmp1 + tmp6);
    wsptr[DCTSIZE * 6] = (int)(tmp1 - tmp6);
    wsptr[DCTSIZE * 2] = (int)(tmp2 + tmp5);
    wsptr[DCTSIZE * 5] = (int)(tmp2 - tmp5);
    wsptr[DCTSIZE * 4] = (int)(tmp3 + tmp4);
    wsptr[DCTSIZE * 3] = (int)(tmp3 - tmp4);

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval =
        range_limit[IDESCALE(wsptr[0], PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp10 = ((DCTELEM)wsptr[0] + (DCTELEM)wsptr[4]);
    tmp11 = ((DCTELEM)wsptr[0] - (DCTELEM)wsptr[4]);

    tmp13 = ((DCTELEM)wsptr[2] + (DCTELEM)wsptr[6]);
    tmp12 =
      MULTIPLY((DCTELEM)wsptr[2] - (DCTELEM)wsptr[6], FIX_1_414213562) - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = (DCTELEM)wsptr[5] + (DCTELEM)wsptr[3];
    z10 = (DCTELEM)wsptr[5] - (DCTELEM)wsptr[3];
    z11 = (DCTELEM)wsptr[1] + (DCTELEM)wsptr[7];
    z12 = (DCTELEM)wsptr[1] - (DCTELEM)wsptr[7];

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, -FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    /* Final output stage: scale down by a factor of 8 and range-limit */

    outptr[0] =
      range_limit[IDESCALE(tmp0 + tmp7, PASS1_BITS + 3) & RANGE_MASK];
    outptr[7] =
      range_limit[IDESCALE(tmp0 - tmp7, PASS1_BITS + 3) & RANGE_MASK];
    outptr[1] =
      range_limit[IDESCALE(tmp1 + tmp6, PASS1_BITS + 3) & RANGE_MASK];
    outptr[6] =
      range_limit[IDESCALE(tmp1 - tmp6, PASS1_BITS + 3) & RANGE_MASK];
    outptr[2] =
      range_limit[IDESCALE(tmp2 + tmp5, PASS1_BITS + 3) & RANGE_MASK];
    outptr[5] =
      range_limit[IDESCALE(tmp2 - tmp5, PASS1_BITS + 3) & RANGE_MASK];
    outptr[4] =
      range_limit[IDESCALE(tmp3 + tmp4, PASS1_BITS + 3) & RANGE_MASK];
    outptr[3] =
      range_limit[IDESCALE(tmp3 - tmp4, PASS1_BITS + 3) & RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}